

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O1

int arm7tdmi_step(arm7tdmi_t *state)

{
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  uint32_t *puVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  undefined4 uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  arm7tdmi_t *paVar13;
  uint32_t *puVar14;
  char *pcVar15;
  uint32_t *puVar16;
  char *pcVar17;
  char *pcVar18;
  uint32_t *puVar19;
  char *pcVar20;
  char *pcVar21;
  thumbinstr_t tVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  arminstr_t instr;
  thumbinstr_t instr_1;
  
  paVar13 = state;
  if ((state->irq == true) && (((uint)state->cpsr & 0x80) == 0)) {
    handle_irq(state);
  }
  uVar9 = SUB84(paVar13,0);
  if ((dbg_window_visible == true) && (tick_on == INSTRUCTION)) {
    actual_dbg_tick();
  }
  state->this_step_ticks = 0;
  if (2 < gba_log_verbosity) {
    uVar9 = 0x123ede;
    printf("[DEBUG] r0:  %08X   r1: %08X   r2: %08X   r3: %08X\n",(ulong)state->r[0],
           (ulong)state->r[1],(ulong)state->r[2],(ulong)state->r[3]);
  }
  if (2 < gba_log_verbosity) {
    uVar9 = 0x123f12;
    printf("[DEBUG] r4:  %08X   r5: %08X   r6: %08X   r7: %08X\n",(ulong)state->r[4],
           (ulong)state->r[5],(ulong)state->r[6],(ulong)state->r[7]);
  }
  if (2 < gba_log_verbosity) {
    puVar4 = state->highreg_fiq;
    puVar14 = state->highreg_fiq + 1;
    bVar23 = ((state->cpsr).raw & 0x1f) != 0x11;
    if (bVar23) {
      puVar14 = state->r + 9;
      puVar4 = state->r + 8;
    }
    puVar16 = state->highreg_fiq + 2;
    if (bVar23) {
      puVar16 = state->r + 10;
    }
    puVar19 = state->highreg_fiq + 3;
    if (bVar23) {
      puVar19 = state->r + 0xb;
    }
    uVar9 = 0x123f46;
    printf("[DEBUG] r8:  %08X   r9: %08X  r10: %08X  r11: %08X\n",(ulong)*puVar4,(ulong)*puVar14,
           (ulong)*puVar16,(ulong)*puVar19);
  }
  if (2 < gba_log_verbosity) {
    uVar2 = (state->cpsr).raw & 0x1f;
    puVar4 = state->r + 0xc;
    if (uVar2 == 0x11) {
      puVar4 = state->highreg_fiq + 4;
    }
    uVar2 = uVar2 - 0x11;
    lVar7 = 0x80;
    if (uVar2 < 0xb) {
      lVar7 = *(long *)(&DAT_00123c90 + (ulong)uVar2 * 8);
    }
    lVar5 = 0x98;
    if (uVar2 < 0xb) {
      lVar5 = *(long *)(&DAT_00123ce8 + (ulong)uVar2 * 8);
    }
    uVar9 = 0x123f7a;
    printf("[DEBUG] r12: %08X  r13: %08X  r14: %08X  r15: %08X\n",(ulong)*puVar4,
           (ulong)*(uint *)((long)state->r + lVar7 + -0x38),
           (ulong)*(uint *)((long)state->r + lVar5 + -0x38),(ulong)state->pc);
  }
  if (2 < gba_log_verbosity) {
    uVar2 = (state->cpsr).raw;
    pcVar8 = "N";
    if (-1 < (int)uVar2) {
      pcVar8 = "-";
    }
    pcVar6 = "Z";
    if ((uVar2 >> 0x1e & 1) == 0) {
      pcVar6 = "-";
    }
    pcVar15 = "C";
    if ((uVar2 >> 0x1d & 1) == 0) {
      pcVar15 = "-";
    }
    auVar24._4_4_ = uVar2;
    auVar24._0_4_ = uVar2;
    auVar24._8_4_ = uVar2;
    auVar24._12_4_ = uVar2;
    auVar24 = auVar24 & _DAT_00123a80;
    auVar25._0_4_ = -(uint)(auVar24._0_4_ == 0);
    auVar25._4_4_ = -(uint)(auVar24._4_4_ == 0);
    auVar25._8_4_ = -(uint)(auVar24._8_4_ == 0);
    auVar25._12_4_ = -(uint)(auVar24._12_4_ == 0);
    uVar10 = movmskps(uVar9,auVar25);
    pcVar17 = "V";
    if ((uVar10 & 8) != 0) {
      pcVar17 = "-";
    }
    pcVar18 = "I";
    if ((uVar10 & 4) != 0) {
      pcVar18 = "-";
    }
    pcVar20 = "F";
    if ((uVar10 & 2) != 0) {
      pcVar20 = "-";
    }
    pcVar21 = "T";
    if ((uVar10 & 1) != 0) {
      pcVar21 = "-";
    }
    printf("[DEBUG] cpsr: %08X [%s%s%s%s%s%s%s]\n",(ulong)uVar2,pcVar8,pcVar6,pcVar15,pcVar17,
           pcVar18,pcVar20,pcVar21);
  }
  if (((uint)state->cpsr & 0x20) == 0) {
    uVar12 = state->pipeline[0];
    state->pipeline[0] = state->pipeline[1];
    uVar11 = state->pc + 4;
    state->pc = uVar11;
    uVar11 = (*state->read_word)(uVar11,ACCESS_NONSEQUENTIAL);
    state->pipeline[1] = uVar11;
    state->instr = uVar12;
    if (1 < gba_log_verbosity) {
      uVar2 = state->pc - 8;
      disassemble_arm(uVar2,uVar12,state->disassembled,0x32);
      if (1 < gba_log_verbosity) {
        printf("\x1b[0;36m[INFO]  [ARM] [%s] 0x%08X: [0x%08X] %s\n\x1b[0;m",
               MODE_NAMES + ((state->cpsr).raw & 0x1f),(ulong)uVar2,(ulong)uVar12,
               state->disassembled);
      }
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] cond: %d\n",(ulong)(uVar12 >> 0x1c));
    }
    iVar3 = (*(code *)(&DAT_00123a90 + *(int *)(&DAT_00123a90 + (ulong)(uVar12 >> 0x1c) * 4)))();
    return iVar3;
  }
  uVar2 = state->pipeline[0];
  tVar22 = (thumbinstr_t)(uVar2 & 0xffff);
  state->pipeline[0] = state->pipeline[1];
  uVar12 = state->pc + 2;
  state->pc = uVar12;
  uVar1 = (*state->read_half)(uVar12,ACCESS_NONSEQUENTIAL);
  state->pipeline[1] = (uint)uVar1;
  state->instr = (uint32_t)tVar22;
  instr_1 = tVar22;
  if (1 < gba_log_verbosity) {
    uVar10 = state->pc - 4;
    disassemble_thumb(uVar10,(uint16_t)uVar2,state->disassembled,0x32);
    if (1 < gba_log_verbosity) {
      printf("\x1b[0;36m[INFO]  [THM] [%s] 0x%08X: [    0x%04X] %s\n\x1b[0;m",
             MODE_NAMES + ((state->cpsr).raw & 0x1f),(ulong)uVar10,(ulong)instr_1.raw,
             state->disassembled);
    }
  }
  (*thm_lut[instr_1.raw >> 6])(state,&instr_1);
  return state->this_step_ticks + (uint)(state->this_step_ticks == 0);
}

Assistant:

int arm7tdmi_step(arm7tdmi_t* state) {
    if (state->irq && !state->cpsr.disable_irq) {
        handle_irq(state);
    }

    dbg_tick(INSTRUCTION);

    state->this_step_ticks = 0;
    logdebug("r0:  %08X   r1: %08X   r2: %08X   r3: %08X", get_register(state, 0), get_register(state, 1), get_register(state, 2), get_register(state, 3))
    logdebug("r4:  %08X   r5: %08X   r6: %08X   r7: %08X", get_register(state, 4), get_register(state, 5), get_register(state, 6), get_register(state, 7))
    logdebug("r8:  %08X   r9: %08X  r10: %08X  r11: %08X", get_register(state, 8), get_register(state, 9), get_register(state, 10), get_register(state, 11))
    logdebug("r12: %08X  r13: %08X  r14: %08X  r15: %08X", get_register(state, 12), get_register(state, 13), get_register(state, 14), get_register(state, 15))
    logdebug("cpsr: %08X [%s%s%s%s%s%s%s]", state->cpsr.raw, cpsrflag(state->cpsr.N, "N"), cpsrflag(state->cpsr.Z, "Z"),
             cpsrflag(state->cpsr.C, "C"), cpsrflag(state->cpsr.V, "V"), cpsrflag(state->cpsr.disable_irq, "I"),
             cpsrflag(state->cpsr.disable_fiq, "F"), cpsrflag(state->cpsr.thumb, "T"))

     int cycles;
     if (state->cpsr.thumb) {
         thumbinstr_t instr = next_thumb_instr(state);
         state->instr = instr.raw;
         word adjusted_pc = state->pc - 4;
         if (gba_log_verbosity >= LOG_VERBOSITY_INFO) {
             disassemble_thumb(adjusted_pc, instr.raw, (char *) &state->disassembled, sizeof(state->disassembled));
             loginfo("[THM] [%s] 0x%08X: [    0x%04X] %s", MODE_NAMES[state->cpsr.mode], adjusted_pc, instr.raw, state->disassembled)
         }
         cycles = thumb_mode_step(state, &instr);
     } else {
         arminstr_t instr = next_arm_instr(state);
         state->instr = instr.raw;
         word adjusted_pc = state->pc - 8;
         if (gba_log_verbosity >= LOG_VERBOSITY_INFO) {
             disassemble_arm(adjusted_pc, instr.raw, (char *) &state->disassembled, sizeof(state->disassembled));
             loginfo("[ARM] [%s] 0x%08X: [0x%08X] %s", MODE_NAMES[state->cpsr.mode], adjusted_pc, instr.raw, state->disassembled)
         }
         cycles = arm_mode_step(state, &instr);
     }

    // Assume a step of 0 cycles is an unknown number of cycles. Consider it 1 cycle
     return cycles == 0 ? 1 : cycles;
}